

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

bool __thiscall ArmParser::matchSymbol(ArmParser *this,Parser *parser,char symbol,bool optional)

{
  bool optional_local;
  char symbol_local;
  Parser *parser_local;
  ArmParser *this_local;
  
  if (symbol == '!') {
    this_local._7_1_ = Parser::matchToken(parser,Exclamation,optional);
  }
  else if (symbol == '#') {
    this_local._7_1_ = Parser::matchToken(parser,Hash,optional);
  }
  else if (symbol == '+') {
    this_local._7_1_ = Parser::matchToken(parser,Plus,optional);
  }
  else if (symbol == ',') {
    this_local._7_1_ = Parser::matchToken(parser,Comma,optional);
  }
  else if (symbol == '=') {
    this_local._7_1_ = Parser::matchToken(parser,Assign,optional);
  }
  else if (symbol == '[') {
    this_local._7_1_ = Parser::matchToken(parser,LBrack,optional);
  }
  else if (symbol == ']') {
    this_local._7_1_ = Parser::matchToken(parser,RBrack,optional);
  }
  else if (symbol == '{') {
    this_local._7_1_ = Parser::matchToken(parser,LBrace,optional);
  }
  else if (symbol == '}') {
    this_local._7_1_ = Parser::matchToken(parser,RBrace,optional);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ArmParser::matchSymbol(Parser& parser, char symbol, bool optional)
{
	switch (symbol)
	{
	case '[':
		return parser.matchToken(TokenType::LBrack,optional);
	case ']':
		return parser.matchToken(TokenType::RBrack,optional);
	case ',':
		return parser.matchToken(TokenType::Comma,optional);
	case '!':
		return parser.matchToken(TokenType::Exclamation,optional);
	case '{':
		return parser.matchToken(TokenType::LBrace,optional);
	case '}':
		return parser.matchToken(TokenType::RBrace,optional);
	case '#':
		return parser.matchToken(TokenType::Hash,optional);
	case '=':
		return parser.matchToken(TokenType::Assign,optional);
	case '+':
		return parser.matchToken(TokenType::Plus,optional);
	}

	return false;
}